

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IIR2xResampler.cpp
# Opt level: O2

void __thiscall
SRCTools::IIR2xInterpolator::process
          (IIR2xInterpolator *this,FloatSample **inSamples,uint *inLength,FloatSample **outSamples,
          uint *outLength)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  IIRSection *pIVar6;
  FloatSample *pFVar7;
  SectionBuffer *paBVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  
  while ((uVar3 = *outLength, uVar3 != 0 && (*inLength != 0))) {
    paBVar8 = (this->super_IIRResampler).constants.buffer;
    uVar4 = this->phase;
    uVar5 = (this->super_IIRResampler).constants.sectionsCount;
    for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
      fVar1 = (*inSamples)[lVar9];
      fVar12 = 0.0;
      if (uVar4 != 0) {
        fVar12 = (this->super_IIRResampler).constants.fir * fVar1;
      }
      fVar2 = this->lastInputSamples[lVar9];
      pIVar6 = (this->super_IIRResampler).constants.sections;
      for (lVar10 = 0; (ulong)uVar5 << 3 != lVar10; lVar10 = lVar10 + 8) {
        fVar13 = *(float *)((long)*paBVar8 + lVar10 + 4);
        if (uVar4 == 0) {
          fVar13 = ((*(float *)((long)&pIVar6->num1 + lVar10 * 2) * fVar2 + 1e-20) -
                   *(float *)((long)&pIVar6->den1 + lVar10 * 2) *
                   *(float *)((long)*paBVar8 + lVar10)) -
                   fVar13 * *(float *)((long)&pIVar6->den2 + lVar10 * 2);
          *(float *)((long)*paBVar8 + lVar10 + 4) = fVar13;
        }
        else {
          fVar13 = ((*(float *)((long)&pIVar6->num2 + lVar10 * 2) * fVar2 + 1e-20) -
                   fVar13 * *(float *)((long)&pIVar6->den1 + lVar10 * 2)) -
                   *(float *)((long)&pIVar6->den2 + lVar10 * 2) *
                   *(float *)((long)*paBVar8 + lVar10);
          *(float *)((long)*paBVar8 + lVar10) = fVar13;
        }
        fVar12 = fVar12 + fVar13;
      }
      pFVar7 = *outSamples;
      *outSamples = pFVar7 + 1;
      *pFVar7 = fVar12 + fVar12;
      if (uVar4 != 0) {
        this->lastInputSamples[lVar9] = fVar1;
      }
      paBVar8 = (SectionBuffer *)((long)*paBVar8 + lVar10);
    }
    *outLength = uVar3 - 1;
    bVar11 = this->phase == 0;
    if (!bVar11) {
      *inSamples = *inSamples + 2;
      *inLength = *inLength - 1;
    }
    this->phase = (uint)bVar11;
  }
  return;
}

Assistant:

void IIR2xInterpolator::process(const FloatSample *&inSamples, unsigned int &inLength, FloatSample *&outSamples, unsigned int &outLength) {
	static const IIRCoefficient INTERPOLATOR_AMP = 2.0;

	while (outLength > 0 && inLength > 0) {
		SectionBuffer *bufferp = constants.buffer;
		for (unsigned int chIx = 0; chIx < IIR_RESAMPER_CHANNEL_COUNT; ++chIx) {
			const FloatSample lastInputSample = lastInputSamples[chIx];
			const FloatSample inSample = inSamples[chIx];
			BufferedSample tmpOut = phase == 0 ? 0 : inSample * constants.fir;
			for (unsigned int i = 0; i < constants.sectionsCount; ++i) {
				const IIRSection &section = constants.sections[i];
				SectionBuffer &buffer = *bufferp;
				// For 2x interpolation, calculation of the numerator reduces to a single multiplication depending on the phase.
				if (phase == 0) {
					const BufferedSample numOutSample = section.num1 * lastInputSample;
					const BufferedSample denOutSample = calcDenominator(section, BIAS + numOutSample, buffer[0], buffer[1]);
					buffer[1] = denOutSample;
					tmpOut += denOutSample;
				} else {
					const BufferedSample numOutSample = section.num2 * lastInputSample;
					const BufferedSample denOutSample = calcDenominator(section, BIAS + numOutSample, buffer[1], buffer[0]);
					buffer[0] = denOutSample;
					tmpOut += denOutSample;
				}
				bufferp++;
			}
			*(outSamples++) = FloatSample(INTERPOLATOR_AMP * tmpOut);
			if (phase > 0) {
				lastInputSamples[chIx] = inSample;
			}
		}
		outLength--;
		if (phase > 0) {
			inSamples += IIR_RESAMPER_CHANNEL_COUNT;
			inLength--;
			phase = 0;
		} else {
			phase = 1;
		}
	}
}